

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_hasNoOutputParameter_Test::testBody
          (TEST_MockExpectedCall_hasNoOutputParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_78;
  MockNamedValue foo;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString((SimpleString *)&foo,"foo");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0xb])(pMVar1,&foo,1);
  SimpleString::~SimpleString((SimpleString *)&foo);
  SimpleString::SimpleString(&SStack_78,"foo");
  MockNamedValue::MockNamedValue(&foo,&SStack_78);
  SimpleString::~SimpleString(&SStack_78);
  MockNamedValue::setValue(&foo,1);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2d])(pMVar1,&foo);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK_FALSE","call->hasOutputParameter(foo)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x2e1,pTVar4);
  MockNamedValue::~MockNamedValue(&foo);
  return;
}

Assistant:

TEST(MockExpectedCall, hasNoOutputParameter)
{
    call->withIntParameter("foo", (int)1);
    MockNamedValue foo("foo");
    foo.setValue((int)1);
    CHECK_FALSE(call->hasOutputParameter(foo));
}